

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O0

void __thiscall QGraphicsRotation::applyTo(QGraphicsRotation *this,QMatrix4x4 *matrix)

{
  double dVar1;
  long lVar2;
  QVector3D vector;
  bool bVar3;
  QGraphicsRotationPrivate *pQVar4;
  ulong uVar5;
  QVector3D *in_RSI;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  QGraphicsRotationPrivate *d;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QGraphicsRotation *)0xa2e48a);
  if ((((pQVar4->angle != 0.0) || (NAN(pQVar4->angle))) &&
      (bVar3 = QVector3D::isNull((QVector3D *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
      !bVar3)) && (uVar5 = qIsNaN(pQVar4->angle), (uVar5 & 1) == 0)) {
    QMatrix4x4::translate(in_RSI);
    dVar1 = pQVar4->angle;
    fVar6 = QVector3D::x(&pQVar4->axis);
    fVar7 = QVector3D::y(&pQVar4->axis);
    fVar8 = QVector3D::z(&pQVar4->axis);
    QMatrix4x4::projectedRotate((float)dVar1,fVar6,fVar7,fVar8);
    vector.v[1] = (float)in_stack_ffffffffffffffcc;
    vector.v[0] = (float)in_stack_ffffffffffffffc8;
    vector.v[2] = (float)*(undefined8 *)(pQVar4->origin).v;
    ::operator-(vector);
    QMatrix4x4::translate(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsRotation::applyTo(QMatrix4x4 *matrix) const
{
    Q_D(const QGraphicsRotation);

    if (d->angle == 0. || d->axis.isNull() || qIsNaN(d->angle))
        return;

    matrix->translate(d->origin);
    matrix->projectedRotate(d->angle, d->axis.x(), d->axis.y(), d->axis.z());
    matrix->translate(-d->origin);
}